

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithGuards::tryRead
          (AsyncIoStreamWithGuards *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncIoStream *pAVar1;
  void *in_R8;
  void *local_30;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncIoStreamWithGuards *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  if ((*(byte *)((long)buffer + 0x48) & 1) == 0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&stack0xffffffffffffffc8);
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)&stack0xffffffffffffffc8);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffc8);
  }
  else {
    local_30 = in_R8;
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)buffer + 0x18));
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (this,pAVar1,minBytes_local,maxBytes_local,local_30);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (readGuardReleased) {
      return inner->tryRead(buffer, minBytes, maxBytes);
    }
    return readGuard.addBranch().then([this, buffer, minBytes, maxBytes] {
      return inner->tryRead(buffer, minBytes, maxBytes);
    });
  }